

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O3

EDist __thiscall BiPtList::yHeightToEnds(BiPtList *this,Pt2i *pt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *in_RDX;
  int iVar9;
  int *piVar10;
  int iVar11;
  Pt2i PVar12;
  int iVar13;
  int iVar14;
  
  iVar1 = in_RDX[1];
  PVar12 = pt[6];
  iVar2 = *(int *)((long)pt[2] + 4);
  if (PVar12 == pt[7]) {
    piVar10 = (int *)(*(long *)((long)pt[9] + -8) + 0x1f8);
    PVar12 = (Pt2i)(*(long *)((long)pt[9] + -8) + 0x200);
  }
  else {
    piVar10 = (int *)((long)PVar12 + -8);
  }
  iVar3 = *in_RDX;
  iVar4 = *(int *)pt[2];
  iVar5 = *piVar10;
  iVar6 = *(int *)((long)PVar12 + -4);
  iVar11 = iVar3;
  iVar14 = iVar1;
  if (iVar1 < iVar2) {
    iVar8 = iVar2;
    iVar7 = iVar4;
    iVar9 = iVar5;
    iVar13 = iVar6;
    if (iVar1 < iVar6) {
      iVar11 = iVar5;
      iVar14 = iVar6;
      if (iVar2 < iVar6) {
        iVar7 = iVar5;
        iVar11 = iVar4;
        iVar14 = iVar2;
      }
      iVar8 = iVar6;
      iVar9 = iVar3;
      iVar13 = iVar1;
      if (iVar6 < iVar2) {
        iVar8 = iVar2;
      }
    }
  }
  else {
    iVar8 = iVar6;
    iVar7 = iVar5;
    iVar9 = iVar4;
    iVar13 = iVar2;
    if (iVar6 <= iVar1) {
      iVar11 = iVar4;
      iVar13 = iVar6;
      if (iVar2 < iVar6) {
        iVar11 = iVar5;
        iVar5 = iVar4;
        iVar13 = iVar2;
      }
      iVar8 = iVar1;
      iVar7 = iVar3;
      iVar9 = iVar5;
      iVar14 = iVar6;
      if (iVar6 < iVar2) {
        iVar14 = iVar2;
      }
    }
  }
  EDist::EDist((EDist *)this,
               (iVar9 - iVar7) * (iVar14 - iVar13) + (iVar11 - iVar9) * (iVar8 - iVar13),
               iVar8 - iVar13);
  return (EDist)this;
}

Assistant:

EDist BiPtList::yHeightToEnds (const Pt2i &pt) const
{
  int xp = pt.x (), yp = pt.y ();
  int p1x = pts.front().x (), p1y = pts.front().y ();
  int p2x = pts.back().x (), p2y = pts.back().y ();
  int ax, ay, bx, by, cx, cy;

  if (yp < p1y)
  {
    if (yp < p2y)
    {
      ax = xp;
      ay = yp;
      if (p1y < p2y)
      {
        bx = p1x;
        by = p1y;
        cx = p2x;
        cy = p2y;
      }
      else
      {
        bx = p2x;
        by = p2y;
        cx = p1x;
        cy = p1y;
      }
    }
    else
    {
      ax = p2x;
      ay = p2y;
      bx = xp;
      by = yp;
      cx = p1x;
      cy = p1y;
    }
  }
  else
  {
    if (yp < p2y)
    {
      ax = p1x;
      ay = p1y;
      bx = xp;
      by = yp;
      cx = p2x;
      cy = p2y;
    }
    else
    {
      cx = xp;
      cy = yp;
      if (p1y < p2y)
      {
        ax = p1x;
        ay = p1y;
        bx = p2x;
        by = p2y;
      }
      else
      {
        ax = p2x;
        ay = p2y;
        bx = p1x;
        by = p1y;
      }
    }
  }
  return (EDist ((bx - ax) * (cy - ay) - (by - ay) * (cx - ax), cy - ay));
}